

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::ReichMoore::
ReichMoore<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ReichMoore *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,151>::ReichMooreLValue,njoy::ENDFtk::section::Type<2,151>::ReichMoore>
  ::BreitWignerReichMooreBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,151>::ReichMooreLValue,njoy::ENDFtk::section::Type<2,151>::ReichMoore>
              *)this,it,end,lineNumber,MAT,MF,MT);
  Type<2,_151>::ReichMoore::verifyNLSC
            ((int)((*(long *)(this + 0x20) - *(long *)(this + 0x18)) / 0x48),*(int *)(this + 0x14));
  return;
}

Assistant:

ReichMoore( Iterator& it, const Iterator& end, long& lineNumber,
            int MAT, int MF, int MT )
  try : BreitWignerReichMooreBase( it, end, lineNumber, MAT, MF, MT ) {

    verifyNLSC( this->NLS(), this->NLSC() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing resonance "
               "parameters in the Reich-Moore representation" );
    throw;
  }